

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_argument_buffer_padding_image_type
          (CompilerMSL *this,SPIRType *struct_type,uint32_t *mbr_idx,uint32_t *arg_buff_index,
          MSLResourceBinding *rez_bind)

{
  TypedID<(spirv_cross::Types)1> local_58;
  Op local_54;
  SPIRType *local_50;
  SPIRType *img_type;
  uint32_t img_type_id;
  SPIRType *base_type;
  MSLResourceBinding *pMStack_30;
  uint32_t base_type_id;
  MSLResourceBinding *rez_bind_local;
  uint32_t *arg_buff_index_local;
  uint32_t *mbr_idx_local;
  SPIRType *struct_type_local;
  CompilerMSL *this_local;
  
  pMStack_30 = rez_bind;
  rez_bind_local = (MSLResourceBinding *)arg_buff_index;
  arg_buff_index_local = mbr_idx;
  mbr_idx_local = (uint32_t *)struct_type;
  struct_type_local = (SPIRType *)this;
  if (this->argument_buffer_padding_image_type_id == 0) {
    base_type._4_4_ = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2);
    img_type._4_4_ = 0x16;
    _img_type_id = Compiler::set<spirv_cross::SPIRType,spv::Op>
                             ((Compiler *)this,base_type._4_4_,(Op *)((long)&img_type + 4));
    _img_type_id->basetype = Float;
    _img_type_id->width = 0x20;
    img_type._0_4_ = base_type._4_4_ + 1;
    local_54 = OpTypeImage;
    local_50 = Compiler::set<spirv_cross::SPIRType,spv::Op>
                         ((Compiler *)this,(uint32_t)img_type,&local_54);
    local_50->basetype = Image;
    local_50->storage = StorageClassUniformConstant;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_58,base_type._4_4_);
    (local_50->image).type.id = local_58.id;
    (local_50->image).dim = Dim2D;
    (local_50->image).depth = false;
    (local_50->image).arrayed = false;
    (local_50->image).ms = false;
    (local_50->image).sampled = 1;
    (local_50->image).format = ImageFormatUnknown;
    (local_50->image).access = AccessQualifierMax;
    this->argument_buffer_padding_image_type_id = (uint32_t)img_type;
  }
  add_argument_buffer_padding_type
            (this,this->argument_buffer_padding_image_type_id,(SPIRType *)mbr_idx_local,
             arg_buff_index_local,&rez_bind_local->stage,pMStack_30->count);
  return;
}

Assistant:

void CompilerMSL::add_argument_buffer_padding_image_type(SPIRType &struct_type, uint32_t &mbr_idx,
                                                         uint32_t &arg_buff_index, MSLResourceBinding &rez_bind)
{
	if (!argument_buffer_padding_image_type_id)
	{
		uint32_t base_type_id = ir.increase_bound_by(2);
		auto &base_type = set<SPIRType>(base_type_id, OpTypeFloat);
		base_type.basetype = SPIRType::Float;
		base_type.width = 32;

		uint32_t img_type_id = base_type_id + 1;
		auto &img_type = set<SPIRType>(img_type_id, OpTypeImage);
		img_type.basetype = SPIRType::Image;
		img_type.storage = StorageClassUniformConstant;

		img_type.image.type = base_type_id;
		img_type.image.dim = Dim2D;
		img_type.image.depth = false;
		img_type.image.arrayed = false;
		img_type.image.ms = false;
		img_type.image.sampled = 1;
		img_type.image.format = ImageFormatUnknown;
		img_type.image.access = AccessQualifierMax;

		argument_buffer_padding_image_type_id = img_type_id;
	}

	add_argument_buffer_padding_type(argument_buffer_padding_image_type_id, struct_type, mbr_idx, arg_buff_index, rez_bind.count);
}